

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Parser.h
# Opt level: O1

Block * __thiscall
soul::StructuralParser::parseBracedBlock
          (StructuralParser *this,pool_ptr<soul::AST::Function> *ownerFunction)

{
  SourceCodeText *o;
  DestructorFn *pDVar1;
  Scope *pSVar2;
  Function *pFVar3;
  bool bVar4;
  Statement *in_RAX;
  PoolItem *pPVar5;
  pool_ref<soul::AST::Statement> local_38;
  
  local_38.object = in_RAX;
  Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
  ::expect<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x263760);
  o = (this->super_SOULTokeniser).location.sourceCode.object;
  if (o != (SourceCodeText *)0x0) {
    (o->super_RefCountedObject).refCount = (o->super_RefCountedObject).refCount + 1;
  }
  pDVar1 = (DestructorFn *)(this->super_SOULTokeniser).location.location.data;
  pSVar2 = this->currentScope;
  pPVar5 = PoolAllocator::allocateSpaceForObject(&this->allocator->pool,0x50);
  pFVar3 = ownerFunction->object;
  pPVar5->item = &PTR__ASTObject_002d4778;
  *(undefined4 *)&pPVar5->field_0x18 = 9;
  pPVar5[1].size = (size_t)o;
  if (o != (SourceCodeText *)0x0) {
    (o->super_RefCountedObject).refCount = (o->super_RefCountedObject).refCount + 1;
  }
  pPVar5[1].destructor = pDVar1;
  pPVar5[1].item = pSVar2;
  pPVar5->item = &PTR__Block_002d6048;
  *(undefined ***)&pPVar5[1].field_0x18 = &PTR__Block_002d6090;
  pPVar5[2].size = (size_t)pFVar3;
  pPVar5[2].destructor = (DestructorFn *)0x0;
  pPVar5[2].item = (void *)0x0;
  *(undefined8 *)&pPVar5[2].field_0x18 = 0;
  pPVar5->destructor =
       PoolAllocator::
       allocate<soul::AST::Block,_soul::AST::Context,_soul::pool_ptr<soul::AST::Function>_&>::
       anon_class_1_0_00000001::__invoke;
  RefCountedPtr<soul::SourceCodeText>::decIfNotNull(o);
  pSVar2 = this->currentScope;
  this->currentScope = (Scope *)&pPVar5[1].field_0x18;
  while( true ) {
    bVar4 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
            ::matchIf<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x26223a);
    if (bVar4) break;
    local_38.object = parseStatement(this);
    std::
    vector<soul::pool_ref<soul::AST::Statement>,std::allocator<soul::pool_ref<soul::AST::Statement>>>
    ::emplace_back<soul::pool_ref<soul::AST::Statement>>
              ((vector<soul::pool_ref<soul::AST::Statement>,std::allocator<soul::pool_ref<soul::AST::Statement>>>
                *)&pPVar5[2].destructor,&local_38);
  }
  this->currentScope = pSVar2;
  return (Block *)&pPVar5->item;
}

Assistant:

AST::Block& parseBracedBlock (pool_ptr<AST::Function> ownerFunction)
    {
        expect (Operator::openBrace);
        auto& newBlock = allocate<AST::Block> (getContext(), ownerFunction);
        ScopedScope scope (*this, newBlock);

        while (! matchIf (Operator::closeBrace))
            newBlock.addStatement (parseStatement());

        return newBlock;
    }